

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O2

uchar FSE_decodeSymbol(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  uchar uVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  uint uVar7;
  
  sVar5 = DStatePtr->state;
  pvVar6 = DStatePtr->table;
  uVar1 = *(uchar *)((long)pvVar6 + sVar5 * 4 + 2);
  bVar2 = *(byte *)((long)pvVar6 + sVar5 * 4 + 3);
  uVar7 = bitD->bitsConsumed + (uint)bVar2;
  uVar3 = *(ushort *)((long)pvVar6 + sVar5 * 4);
  uVar4 = BIT_mask[bVar2];
  bitD->bitsConsumed = uVar7;
  DStatePtr->state =
       (ulong)((uint)(bitD->bitContainer >> (-(char)uVar7 & 0x3fU)) & uVar4) + (ulong)uVar3;
  return uVar1;
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbol(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBits(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}